

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

cupdlp_int csc_clear_host(CUPDLPcsc *csc)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 0x10) != 0) {
      free(*(void **)((long)in_RDI + 0x10));
      *(undefined8 *)((long)in_RDI + 0x10) = 0;
    }
    if (*(long *)((long)in_RDI + 0x18) != 0) {
      free(*(void **)((long)in_RDI + 0x18));
      *(undefined8 *)((long)in_RDI + 0x18) = 0;
    }
    if (*(long *)((long)in_RDI + 0x20) != 0) {
      free(*(void **)((long)in_RDI + 0x20));
      *(undefined8 *)((long)in_RDI + 0x20) = 0;
    }
    free(in_RDI);
  }
  return 0;
}

Assistant:

cupdlp_int csc_clear_host(CUPDLPcsc *csc) {
  if (csc) {
    if (csc->colMatBeg) {
      cupdlp_free(csc->colMatBeg);
    }
    if (csc->colMatIdx) {
      cupdlp_free(csc->colMatIdx);
    }
    if (csc->colMatElem) {
      cupdlp_free(csc->colMatElem);
    }
    cupdlp_free(csc);
  }
  return 0;
}